

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void t_outline(out_stream_info *stream,int nl,char *txt,int *attr)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  out_stream_info *in_RDI;
  char *dst;
  char buf [2048];
  size_t i;
  char *in_stack_fffffffffffff7c8;
  out_stream_info *stream_00;
  undefined1 local_828 [2088];
  
  if ((scrquiet == 0) || (in_RDI != &G_std_disp)) {
    local_828._2056_8_ = in_RCX;
    local_828._2064_8_ = in_RDX;
    local_828._2080_8_ = in_RDI;
    if ((in_RDI->use_more_mode != 0) &&
       ((((scrfp == (FILE *)0x0 && (G_os_moremode != 0)) && (in_ESI != 0)) &&
        ((in_ESI != 4 &&
         (iVar1 = in_RDI->linecnt, in_RDI->linecnt = iVar1 + 1, G_os_pagelength <= iVar1)))))) {
      out_more_prompt();
    }
    stream_00 = (out_stream_info *)local_828;
    for (local_828._2048_8_ = 0; *(char *)(local_828._2064_8_ + local_828._2048_8_) != '\0';
        local_828._2048_8_ = local_828._2048_8_ + 1) {
      if ((local_828._2056_8_ != 0) &&
         (*(int *)(local_828._2056_8_ + local_828._2048_8_ * 4) !=
          *(int *)(local_828._2080_8_ + 0x2814))) {
        if (stream_00 != (out_stream_info *)local_828) {
          *(undefined1 *)&stream_00->do_print = 0;
          stream_print(stream_00,in_stack_fffffffffffff7c8);
        }
        os_set_text_attr(*(int *)(local_828._2056_8_ + local_828._2048_8_ * 4));
        *(int *)(local_828._2080_8_ + 0x2814) =
             *(int *)(local_828._2056_8_ + local_828._2048_8_ * 4);
        stream_00 = (out_stream_info *)local_828;
      }
      *(undefined1 *)&stream_00->do_print = *(undefined1 *)(local_828._2064_8_ + local_828._2048_8_)
      ;
      stream_00 = (out_stream_info *)((long)&stream_00->do_print + 1);
    }
    if (stream_00 != (out_stream_info *)local_828) {
      *(undefined1 *)&stream_00->do_print = 0;
      stream_print(stream_00,in_stack_fffffffffffff7c8);
    }
  }
  return;
}

Assistant:

static void t_outline(out_stream_info *stream, int nl,
                      const char *txt, const int *attr)
{
    extern int scrquiet;

    /* 
     *   Check the "script quiet" mode - this indicates that we're reading
     *   a script and not echoing output to the display.  If this mode is
     *   on, and we're writing to the display, suppress this write.  If
     *   the mode is off, or we're writing to another stream (such as the
     *   log file), show the output as normal.  
     */
    if (!scrquiet || stream != &G_std_disp)
    {
        size_t i;
        char buf[MAXWIDTH];
        char *dst;
        
        /*
         *   Check to see if we've reached the end of the screen, and if
         *   so run the MORE prompt.  Note that we don't make this check
         *   at all if USE_MORE is undefined, since this means that the OS
         *   layer code is taking responsibility for pagination issues.
         *   We also don't display a MORE prompt when reading from a
         *   script file.
         *   
         *   Note that we suppress the MORE prompt if nl == 0, since this
         *   is used to flush a partial line of text without starting a
         *   new line (for example, when displaying a prompt where the
         *   input will appear on the same line following the prompt).
         *   
         *   Skip the MORE prompt if this stream doesn't use it.  
         */
        if (stream->use_more_mode
            && scrfp == 0
            && G_os_moremode
            && nl != 0 && nl != 4
            && stream->linecnt++ >= G_os_pagelength)
        {
            /* display the MORE prompt */
            out_more_prompt();
        }

        /*
         *   Display the text.  Run through the text in pieces; each time the
         *   attributes change, set attributes at the osifc level. 
         */
        for (i = 0, dst = buf ; txt[i] != '\0' ; ++i)
        {
            /* if the attribute is changing, notify osifc */
            if (attr != 0 && attr[i] != stream->os_attr)
            {
                /* flush the preceding text */
                if (dst != buf)
                {
                    *dst = '\0';
                    stream_print(stream, buf);
                }

                /* set the new attribute */
                os_set_text_attr(attr[i]);

                /* remember this as the last OS attribute */
                stream->os_attr = attr[i];

                /* start with a fresh buffer */
                dst = buf;
            }

            /* buffer this character */
            *dst++ = txt[i];
        }

        /* flush the last chunk of text */
        if (dst != buf)
        {
            *dst = '\0';
            stream_print(stream, buf);
        }
    }
}